

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O3

ZyanStatus
ZydisFormatterBaseFormatOperandIMM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  long lVar2;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,199,
                  "ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context != (ZydisFormatterContext *)0x0) {
      if ((context->operand->field_10).imm.is_relative == '\0') {
        lVar2 = 0x220;
      }
      else if ((formatter->force_relative_branches != '\0') ||
              (lVar2 = 0x208, context->runtime_address == 0xffffffffffffffff)) {
        lVar2 = 0x210;
      }
      ZVar1 = (**(code **)((long)(formatter->number_format + -1) + 0x60 + lVar2))();
      return ZVar1;
    }
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xc9,
                  "ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                ,200,
                "ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterBaseFormatOperandIMM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    // The immediate operand contains an address
    if (context->operand->imm.is_relative)
    {
        const ZyanBool absolute = !formatter->force_relative_branches &&
            (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
        if (absolute)
        {
            return formatter->func_print_address_abs(formatter, buffer, context);
        }
        return formatter->func_print_address_rel(formatter, buffer, context);
    }

    // The immediate operand contains an actual ordinal value
    return formatter->func_print_imm(formatter, buffer, context);
}